

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  int iVar1;
  undefined8 *workSpace_00;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int *piVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  bool bVar10;
  char cVar11;
  char cVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  U32 UVar21;
  int iVar22;
  uint uVar23;
  size_t sVar24;
  ulong uVar25;
  byte bVar26;
  uint uVar27;
  HUF_DTable HVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  uint uVar37;
  U32 curr_1;
  uint *puVar38;
  uint uVar39;
  size_t sVar40;
  ulong uVar41;
  U32 *rankVal0;
  int iVar43;
  undefined1 auVar42 [16];
  int iVar46;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  U32 nbSymbols;
  U32 tableLog;
  
  sVar40 = 0xffffffffffffffff;
  if (0x943 < wkspSize) {
    uVar9 = *DTable;
    uVar27 = uVar9 & 0xff;
    *(undefined1 (*) [16])((long)workSpace + 0x2cc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)workSpace + 0x2c0) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)workSpace + 0x2b0) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)workSpace + 0x2a0) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)workSpace + 0x290) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)workSpace + 0x280) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)workSpace + 0x270) = (undefined1  [16])0x0;
    sVar40 = 0xffffffffffffffd4;
    if (uVar27 < 0xd) {
      workSpace_00 = (undefined8 *)((long)workSpace + 0x5dc);
      sVar24 = HUF_readStats_wksp((BYTE *)((long)workSpace + 0x4dc),0x100,
                                  (U32 *)((long)workSpace + 0x270),&nbSymbols,&tableLog,src,srcSize,
                                  workSpace_00,0x368,0);
      sVar40 = sVar24;
      if (sVar24 < 0xffffffffffffff89) {
        cVar12 = (char)uVar9;
        sVar40 = 0xffffffffffffffd4;
        if (tableLog <= uVar27) {
          iVar1 = tableLog + 1;
          uVar39 = 0;
          UVar21 = tableLog;
          do {
            uVar35 = (ulong)UVar21;
            UVar21 = UVar21 - 1;
            uVar39 = uVar39 + 1;
          } while (((U32 *)((long)workSpace + 0x270))[uVar35] == 0);
          uVar30 = (tableLog - uVar39) + 2;
          uVar37 = 0;
          if (UVar21 < 0xfffffffe) {
            lVar34 = 0;
            uVar33 = 0;
            do {
              uVar37 = *(int *)((long)workSpace + lVar34 * 4 + 0x274) + uVar33;
              *(uint *)((long)workSpace + lVar34 * 4 + 0x2ac) = uVar33;
              lVar34 = lVar34 + 1;
              uVar33 = uVar37;
            } while ((ulong)uVar30 - 1 != lVar34);
          }
          *(uint *)((long)workSpace + 0x2a8) = uVar37;
          if ((ulong)nbSymbols != 0) {
            uVar35 = 0;
            do {
              bVar5 = *(byte *)((long)workSpace + uVar35 + 0x4dc);
              uVar33 = *(uint *)((long)workSpace + (ulong)bVar5 * 4 + 0x2a8);
              *(uint *)((long)workSpace + (ulong)bVar5 * 4 + 0x2a8) = uVar33 + 1;
              *(char *)((long)workSpace + (ulong)uVar33 * 2 + 0x2dc) = (char)uVar35;
              *(byte *)((long)workSpace + (ulong)uVar33 * 2 + 0x2dd) = bVar5;
              uVar35 = uVar35 + 1;
            } while (nbSymbols != uVar35);
          }
          uVar33 = (uVar27 - uVar39) + 1;
          *(undefined4 *)((long)workSpace + 0x2a8) = 0;
          if (UVar21 < 0xfffffffe) {
            lVar34 = 0;
            iVar22 = 0;
            do {
              lVar36 = lVar34 * 4;
              cVar11 = (char)lVar34;
              *(int *)((long)workSpace + lVar34 * 4 + 4) = iVar22;
              lVar34 = lVar34 + 1;
              iVar22 = (*(int *)((long)workSpace + lVar36 + 0x274) <<
                       ((cVar12 - (char)tableLog) + cVar11 & 0x1fU)) + iVar22;
            } while ((ulong)uVar30 - 1 != lVar34);
          }
          if (uVar39 < uVar33) {
            uVar35 = (ulong)uVar39;
            lVar34 = uVar35 * 0x34;
            do {
              lVar36 = (ulong)uVar30 - 1;
              puVar38 = (uint *)((long)workSpace + 4);
              if (UVar21 < 0xfffffffe) {
                do {
                  *(uint *)((long)puVar38 + lVar34) = *puVar38 >> ((byte)uVar35 & 0x1f);
                  lVar36 = lVar36 + -1;
                  puVar38 = puVar38 + 1;
                } while (lVar36 != 0);
              }
              uVar35 = uVar35 + 1;
              lVar34 = lVar34 + 0x34;
            } while (uVar33 != (uint)uVar35);
          }
          *(undefined4 *)((long)workSpace + 0x60c) = *(undefined4 *)((long)workSpace + 0x30);
          *(undefined8 *)((long)workSpace + 0x5fc) = *(undefined8 *)((long)workSpace + 0x20);
          *(undefined8 *)((long)workSpace + 0x604) = *(undefined8 *)((long)workSpace + 0x28);
          *(undefined8 *)((long)workSpace + 0x5ec) = *(undefined8 *)((long)workSpace + 0x10);
          *(undefined8 *)((long)workSpace + 0x5f4) = *(undefined8 *)((long)workSpace + 0x18);
          *workSpace_00 = *workSpace;
          *(undefined8 *)((long)workSpace + 0x5e4) = *(undefined8 *)((long)workSpace + 8);
          auVar20 = _DAT_006bcbf0;
          auVar19 = _DAT_006a9900;
          auVar18 = _DAT_006a98f0;
          if (uVar37 != 0) {
            puVar2 = (undefined8 *)((long)workSpace + 0x610);
            uVar35 = 0;
            do {
              bVar5 = *(byte *)((long)workSpace + uVar35 * 2 + 0x2dc);
              bVar6 = *(byte *)((long)workSpace + uVar35 * 2 + 0x2dd);
              uVar33 = iVar1 - (uint)bVar6;
              uVar30 = *(uint *)((long)workSpace_00 + (ulong)bVar6 * 4);
              uVar41 = (ulong)uVar30;
              bVar26 = (byte)(uVar27 - uVar33);
              iVar22 = 1 << (bVar26 & 0x1f);
              if (uVar27 - uVar33 < uVar39) {
                uVar23 = iVar22 + uVar30;
                if (uVar30 < uVar23) {
                  HVar28 = (uVar33 & 0xff) * 0x10000 + (uint)bVar5 + 0x1000000;
                  lVar34 = uVar23 - uVar41;
                  lVar36 = lVar34 + -1;
                  auVar47._8_4_ = (int)lVar36;
                  auVar47._0_8_ = lVar36;
                  auVar47._12_4_ = (int)((ulong)lVar36 >> 0x20);
                  uVar32 = 0;
                  do {
                    auVar48._8_4_ = (int)uVar32;
                    auVar48._0_8_ = uVar32;
                    auVar48._12_4_ = (int)(uVar32 >> 0x20);
                    auVar44 = (auVar48 | auVar18) ^ auVar19;
                    iVar31 = SUB164(auVar47 ^ auVar19,0);
                    bVar10 = iVar31 < auVar44._0_4_;
                    iVar43 = SUB164(auVar47 ^ auVar19,4);
                    iVar46 = auVar44._4_4_;
                    if ((bool)(~(iVar43 < iVar46 || iVar46 == iVar43 && bVar10) & 1)) {
                      DTable[uVar41 + uVar32 + 1] = HVar28;
                    }
                    if (iVar43 >= iVar46 && (iVar46 != iVar43 || !bVar10)) {
                      DTable[uVar41 + uVar32 + 2] = HVar28;
                    }
                    auVar44 = (auVar48 | auVar20) ^ auVar19;
                    iVar46 = auVar44._4_4_;
                    if (iVar46 <= iVar43 && (iVar46 != iVar43 || auVar44._0_4_ <= iVar31)) {
                      DTable[uVar41 + uVar32 + 3] = HVar28;
                      DTable[uVar41 + uVar32 + 4] = HVar28;
                    }
                    uVar32 = uVar32 + 4;
                  } while ((lVar34 + 3U & 0xfffffffffffffffc) != uVar32);
                }
              }
              else {
                uVar30 = uVar33 + (iVar1 - uVar27);
                uVar32 = 1;
                if (1 < (int)uVar30) {
                  uVar32 = (ulong)uVar30;
                }
                uVar23 = *(uint *)((long)workSpace + uVar32 * 4 + 0x2a4);
                lVar34 = (ulong)uVar33 * 0x34;
                *(undefined4 *)((long)workSpace + 0x640) =
                     *(undefined4 *)((long)workSpace + lVar34 + 0x30);
                uVar13 = *(undefined8 *)((long)workSpace + lVar34);
                uVar14 = ((undefined8 *)((long)workSpace + lVar34))[1];
                puVar3 = (undefined8 *)((long)workSpace + lVar34 + 0x10);
                uVar15 = *puVar3;
                uVar16 = puVar3[1];
                puVar3 = (undefined8 *)((long)workSpace + lVar34 + 0x20);
                uVar17 = puVar3[1];
                *(undefined8 *)((long)workSpace + 0x630) = *puVar3;
                *(undefined8 *)((long)workSpace + 0x638) = uVar17;
                *(undefined8 *)((long)workSpace + 0x620) = uVar15;
                *(undefined8 *)((long)workSpace + 0x628) = uVar16;
                *puVar2 = uVar13;
                *(undefined8 *)((long)workSpace + 0x618) = uVar14;
                if ((1 < (int)uVar30) &&
                   (uVar32 = (ulong)*(uint *)((long)puVar2 + uVar32 * 4), uVar32 != 0)) {
                  iVar31 = (uVar33 & 0xff) * 0x10000 + (uint)bVar5 + 0x1000000;
                  lVar34 = uVar32 - 1;
                  auVar42._8_4_ = (int)lVar34;
                  auVar42._0_8_ = lVar34;
                  auVar42._12_4_ = (int)((ulong)lVar34 >> 0x20);
                  lVar34 = uVar41 * 4;
                  uVar25 = 0;
                  auVar44 = auVar18;
                  auVar45 = auVar20;
                  do {
                    auVar47 = auVar42 ^ auVar19;
                    auVar48 = auVar44 ^ auVar19;
                    iVar43 = auVar47._4_4_;
                    if ((bool)(~(iVar43 < auVar48._4_4_ ||
                                auVar47._0_4_ < auVar48._0_4_ && auVar48._4_4_ == iVar43) & 1)) {
                      *(int *)((long)DTable + uVar25 + lVar34 + 4) = iVar31;
                    }
                    if (auVar48._12_4_ <= auVar47._12_4_ &&
                        (auVar48._8_4_ <= auVar47._8_4_ || auVar48._12_4_ != auVar47._12_4_)) {
                      *(int *)((long)DTable + uVar25 + lVar34 + 8) = iVar31;
                    }
                    iVar46 = SUB164(auVar45 ^ auVar19,4);
                    if (iVar46 <= iVar43 &&
                        (iVar46 != iVar43 || SUB164(auVar45 ^ auVar19,0) <= auVar47._0_4_)) {
                      *(int *)((long)DTable + uVar25 + lVar34 + 0xc) = iVar31;
                      *(int *)((long)DTable + uVar25 + lVar34 + 0x10) = iVar31;
                    }
                    lVar36 = auVar44._8_8_;
                    auVar44._0_8_ = auVar44._0_8_ + 4;
                    auVar44._8_8_ = lVar36 + 4;
                    lVar36 = auVar45._8_8_;
                    auVar45._0_8_ = auVar45._0_8_ + 4;
                    auVar45._8_8_ = lVar36 + 4;
                    uVar25 = uVar25 + 0x10;
                  } while ((uVar32 * 4 + 0xc & 0xfffffffffffffff0) != uVar25);
                }
                if (uVar37 != uVar23) {
                  uVar32 = 0;
                  do {
                    bVar7 = *(byte *)((long)workSpace + uVar32 * 2 + (ulong)uVar23 * 2 + 0x2dc);
                    bVar8 = *(byte *)((long)workSpace + uVar32 * 2 + (ulong)uVar23 * 2 + 0x2dd);
                    iVar31 = 1 << (bVar26 - (char)(iVar1 - (uint)bVar8) & 0x1f);
                    uVar29 = *(uint *)((long)puVar2 + (ulong)bVar8 * 4);
                    uVar30 = iVar31 + uVar29;
                    do {
                      uVar25 = (ulong)uVar29;
                      uVar29 = uVar29 + 1;
                      DTable[uVar41 + uVar25 + 1] =
                           (uint)bVar5 +
                           (((iVar1 - (uint)bVar8) + uVar33 & 0xff) << 0x10 | (uint)bVar7 << 8) +
                           0x2000000;
                    } while (uVar29 < uVar30);
                    piVar4 = (int *)((long)puVar2 + (ulong)bVar8 * 4);
                    *piVar4 = *piVar4 + iVar31;
                    uVar32 = uVar32 + 1;
                  } while (uVar32 != uVar37 - uVar23);
                }
              }
              piVar4 = (int *)((long)workSpace_00 + (ulong)bVar6 * 4);
              *piVar4 = *piVar4 + iVar22;
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar37);
          }
          *(char *)DTable = cVar12;
          *(undefined1 *)((long)DTable + 1) = 1;
          *(char *)((long)DTable + 2) = cVar12;
          *(char *)((long)DTable + 3) = (char)(uVar9 >> 0x18);
          sVar40 = sVar24;
        }
      }
    }
  }
  return sVar40;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize)
{
    U32 tableLog, maxW, sizeOfSort, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 const maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    HUF_ReadDTableX2_Workspace* const wksp = (HUF_ReadDTableX2_Workspace*)workSpace;

    if (sizeof(*wksp) > wkspSize) return ERROR(GENERIC);

    rankStart = wksp->rankStart0 + 1;
    ZSTD_memset(wksp->rankStats, 0, sizeof(wksp->rankStats));
    ZSTD_memset(wksp->rankStart0, 0, sizeof(wksp->rankStart0));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* ZSTD_memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->weightList, HUF_SYMBOLVALUE_MAX + 1, wksp->rankStats, &nbSymbols, &tableLog, src, srcSize, wksp->calleeWksp, sizeof(wksp->calleeWksp), /* bmi2 */ 0);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */

    /* find maxWeight */
    for (maxW = tableLog; wksp->rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 curr = nextRankStart;
            nextRankStart += wksp->rankStats[w];
            rankStart[w] = curr;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        sizeOfSort = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = wksp->weightList[s];
            U32 const r = rankStart[w]++;
            wksp->sortedSymbol[r].symbol = (BYTE)s;
            wksp->sortedSymbol[r].weight = (BYTE)w;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = wksp->rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 curr = nextRankVal;
                nextRankVal += wksp->rankStats[w] << (w+rescale);
                rankVal0[w] = curr;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = wksp->rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   wksp->sortedSymbol, sizeOfSort,
                   wksp->rankStart0, wksp->rankVal, maxW,
                   tableLog+1,
                   wksp->calleeWksp, sizeof(wksp->calleeWksp) / sizeof(U32));

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}